

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O0

DirectPropertyMap * __thiscall
Assimp::FBX::PropertyTable::GetUnparsedProperties_abi_cxx11_
          (DirectPropertyMap *__return_storage_ptr__,PropertyTable *this)

{
  bool bVar1;
  Property *__p;
  mapped_type *this_00;
  undefined1 local_70 [8];
  shared_ptr<Assimp::FBX::Property> prop;
  _Self local_50;
  _Self local_48;
  reference local_40;
  value_type *element;
  const_iterator __end2;
  const_iterator __begin2;
  LazyPropertyMap *__range2;
  PropertyTable *this_local;
  DirectPropertyMap *result;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::map(__return_storage_ptr__);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
           ::begin(&this->lazyProps);
  element = (value_type *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
            ::end(&this->lazyProps);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&element), bVar1) {
    local_40 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
               ::operator*(&__end2);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>_>_>
         ::end(&this->props);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>_>_>
         ::find(&this->props,&local_40->first);
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) {
      __p = anon_unknown_8::ReadTypedProperty(local_40->second);
      std::shared_ptr<Assimp::FBX::Property>::shared_ptr<Assimp::FBX::Property,void>
                ((shared_ptr<Assimp::FBX::Property> *)local_70,__p);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
      if (bVar1) {
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                  ::operator[](__return_storage_ptr__,&local_40->first);
        std::shared_ptr<Assimp::FBX::Property>::operator=
                  (this_00,(shared_ptr<Assimp::FBX::Property> *)local_70);
      }
      std::shared_ptr<Assimp::FBX::Property>::~shared_ptr
                ((shared_ptr<Assimp::FBX::Property> *)local_70);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

DirectPropertyMap PropertyTable::GetUnparsedProperties() const
{
    DirectPropertyMap result;

    // Loop through all the lazy properties (which is all the properties)
    for(const LazyPropertyMap::value_type& element : lazyProps) {

        // Skip parsed properties
        if (props.end() != props.find(element.first)) continue;

        // Read the element's value.
        // Wrap the naked pointer (since the call site is required to acquire ownership)
        // std::unique_ptr from C++11 would be preferred both as a wrapper and a return value.
        std::shared_ptr<Property> prop = std::shared_ptr<Property>(ReadTypedProperty(*element.second));

        // Element could not be read. Skip it.
        if (!prop) continue;

        // Add to result
        result[element.first] = prop;
    }

    return result;
}